

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

SupportVectorRegressor * __thiscall
CoreML::Specification::Model::mutable_supportvectorregressor(Model *this)

{
  SupportVectorRegressor *this_00;
  
  if (this->_oneof_case_[0] == 0x12d) {
    this_00 = (SupportVectorRegressor *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x12d;
    this_00 = (SupportVectorRegressor *)operator_new(0x38);
    SupportVectorRegressor::SupportVectorRegressor(this_00);
    (this->Type_).supportvectorregressor_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::SupportVectorRegressor* Model::mutable_supportvectorregressor() {
  if (!has_supportvectorregressor()) {
    clear_Type();
    set_has_supportvectorregressor();
    Type_.supportvectorregressor_ = new ::CoreML::Specification::SupportVectorRegressor;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.supportVectorRegressor)
  return Type_.supportvectorregressor_;
}